

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O2

void __thiscall
sentencepiece::SentencePieceText::SentencePieceText(SentencePieceText *this,Arena *arena)

{
  (this->super_MessageLite)._internal_metadata_.ptr_ = arena;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SentencePieceText_00218528;
  google::protobuf::internal::ExtensionSet::ExtensionSet(&this->_extensions_,arena);
  this->_has_bits_ = (uint32  [1])0x0;
  this->_cached_size_ = (atomic<int>)0x0;
  (this->pieces_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->pieces_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->pieces_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->pieces_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  SharedCtor(this);
  return;
}

Assistant:

SentencePieceText::SentencePieceText(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena),
  _extensions_(arena),
  pieces_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:sentencepiece.SentencePieceText)
}